

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

IndirOpnd * __thiscall IR::IndirOpnd::CopyInternal(IndirOpnd *this,Func *func)

{
  byte bVar1;
  undefined1 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  IndirOpnd *this_00;
  
  if ((this->super_Opnd).m_kind != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xa18,"(m_kind == OpndKindIndir)","m_kind == OpndKindIndir");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  bVar1 = this->m_scale;
  this_00 = New(this->m_baseOpnd,this->m_indexOpnd,(this->super_Opnd).m_type,func);
  this_00->m_scale = bVar1;
  (this_00->super_Opnd).m_valueType.field_0 = (this->super_Opnd).m_valueType.field_0;
  (this_00->super_Opnd).field_0xb =
       (this_00->super_Opnd).field_0xb & 0xef | (this->super_Opnd).field_0xb & 0x10;
  uVar2 = (this->super_Opnd).field_0xe;
  this_00->m_offset = this->m_offset;
  (this_00->super_Opnd).field_0xe = uVar2;
  Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,(bool)(((this->super_Opnd).field_0xb & 8) >> 3));
  this_00->m_conversionAllowed = this->m_conversionAllowed;
  this_00->m_addrKind = this->m_addrKind;
  this_00->m_originalAddress = this->m_originalAddress;
  return this_00;
}

Assistant:

IndirOpnd *
IndirOpnd::CopyInternal(Func *func)
{
    Assert(m_kind == OpndKindIndir);
    IndirOpnd * newOpnd;

    newOpnd = IndirOpnd::New(m_baseOpnd, m_indexOpnd, m_scale, m_type, func);

    newOpnd->m_valueType = m_valueType;
    newOpnd->canStoreTemp = this->canStoreTemp;
    newOpnd->SetOffset(m_offset, m_dontEncode);
    newOpnd->SetIsJITOptimizedReg(this->GetIsJITOptimizedReg());
    newOpnd->m_conversionAllowed = this->m_conversionAllowed;

#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
    newOpnd->m_originalAddress = m_originalAddress;
#endif
    return newOpnd;
}